

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O1

string * __thiscall
glcts::InterfaceMatchingCase::getTestTypeName_abi_cxx11_
          (string *__return_storage_ptr__,InterfaceMatchingCase *this,TestType testType)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (testType == SET_PRECISION) {
    pcVar2 = "explicit precision";
    pcVar1 = "";
  }
  else if (testType == SET_DEFAULT_PRECISION) {
    pcVar2 = "set default precision";
    pcVar1 = "";
  }
  else if (testType == DEFAULT_PRECISION) {
    pcVar2 = "use predeclared precision";
    pcVar1 = "";
  }
  else {
    pcVar1 = "";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string getTestTypeName(TestType testType)
	{
		switch (testType)
		{
		case DEFAULT_PRECISION:
			return "use predeclared precision";
		case SET_DEFAULT_PRECISION:
			return "set default precision";
		case SET_PRECISION:
			return "explicit precision";
		}
		return "";
	}